

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_UInt FT_Face_GetCharVariantIndex(FT_Face face,FT_ULong charcode,FT_ULong variantSelector)

{
  FT_CharMap pFVar1;
  FT_CMap_conflict vcmap;
  FT_CMap_conflict ucmap;
  FT_CharMap charmap;
  FT_UInt result;
  FT_ULong variantSelector_local;
  FT_ULong charcode_local;
  FT_Face face_local;
  
  charmap._4_4_ = 0;
  if (((face != (FT_Face)0x0) && (face->charmap != (FT_CharMap)0x0)) &&
     (face->charmap->encoding == FT_ENCODING_UNICODE)) {
    pFVar1 = find_variant_selector_charmap(face);
    if (pFVar1 != (FT_CharMap)0x0) {
      charmap._4_4_ =
           (*(code *)(pFVar1[1].face)->family_name)
                     (pFVar1,face->charmap,charcode & 0xffffffff,variantSelector);
    }
  }
  return charmap._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_UInt )
  FT_Face_GetCharVariantIndex( FT_Face   face,
                               FT_ULong  charcode,
                               FT_ULong  variantSelector )
  {
    FT_UInt  result = 0;


    if ( face                                           &&
         face->charmap                                  &&
         face->charmap->encoding == FT_ENCODING_UNICODE )
    {
      FT_CharMap  charmap = find_variant_selector_charmap( face );
      FT_CMap     ucmap = FT_CMAP( face->charmap );


      if ( charmap )
      {
        FT_CMap  vcmap = FT_CMAP( charmap );


        if ( charcode > 0xFFFFFFFFUL )
        {
          FT_TRACE1(( "FT_Face_GetCharVariantIndex:"
                      " too large charcode" ));
          FT_TRACE1(( " 0x%lx is truncated\n", charcode ));
        }
        if ( variantSelector > 0xFFFFFFFFUL )
        {
          FT_TRACE1(( "FT_Face_GetCharVariantIndex:"
                      " too large variantSelector" ));
          FT_TRACE1(( " 0x%lx is truncated\n", variantSelector ));
        }

        result = vcmap->clazz->char_var_index( vcmap, ucmap,
                                               (FT_UInt32)charcode,
                                               (FT_UInt32)variantSelector );
      }
    }

    return result;
  }